

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

bool tao::pegtl::internal::string<(char)103,(char)114,(char)97,(char)109,(char)51>::
     match<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in)

{
  bool bVar1;
  size_t sVar2;
  undefined8 in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_00;
  size_t in_stack_ffffffffffffffe8;
  
  sVar2 = memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_RDI,in_stack_ffffffffffffffe8);
  if (4 < sVar2) {
    memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::current((memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(in_RDI + 0x20));
    uVar3 = CONCAT13(0x67,(int3)in_stack_ffffffffffffffd8);
    uVar4 = 0x72;
    uVar5 = 0x61;
    uVar6 = 0x6d;
    uVar7 = 0x33;
    in_00 = (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffffdb;
    bVar1 = unsafe_equals((char *)in_RDI,(initializer_list<char> *)0x5);
    if (bVar1) {
      bump_help<(tao::pegtl::internal::result_on_found)1,_tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,__g_,__r_,__a_,__m_,__3_>
                (in_00,CONCAT17(uVar7,CONCAT16(uVar6,CONCAT15(uVar5,CONCAT14(uVar4,uVar3)))));
      return true;
    }
  }
  return false;
}

Assistant:

static bool match( Input& in ) noexcept( noexcept( in.size( 0 ) ) )
            {
               if( in.size( sizeof...( Cs ) ) >= sizeof...( Cs ) ) {
                  if( unsafe_equals( in.current(), { Cs... } ) ) {
                     bump_help< result_on_found::SUCCESS, Input, char, Cs... >( in, sizeof...( Cs ) );
                     return true;
                  }
               }
               return false;
            }